

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O3

void incusecount68k(FX *fx68k)

{
  uint *puVar1;
  DLword *pDVar2;
  ushort uVar3;
  byte bVar4;
  DLword DVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((fx68k != (FX *)0x0) && ((FX *)Stackspace != fx68k)) {
    bVar4 = (char)*(undefined2 *)&fx68k->field_0x2 + 1;
    fx68k->field_0x2 = bVar4;
    if (200 < bVar4) {
      error("MP9324:Stack frame use count maximum exceeded");
    }
    pDVar2 = Stackspace + fx68k->nextblock;
    uVar3 = *(ushort *)((ulong)pDVar2 ^ 2) >> 0xd;
    if (uVar3 == 4) {
      puVar1 = (uint *)(pDVar2 + 2);
      if (((*(ushort *)((ulong)puVar1 ^ 2) & 0xe000) == 0xc000) &&
         (uVar6 = *puVar1, (uVar6 & 1) == 0)) {
        uVar7 = (long)pDVar2 - (long)Stackspace >> 1;
        DVar5 = (DLword)uVar6;
        if (0xffff < uVar7) {
          printf("Stack offset is out of range: 0x%tx\n",uVar7,(ulong)(uint)uVar3);
          DVar5 = (DLword)*puVar1;
          uVar6 = *puVar1;
        }
        pDVar2[0xb] = (DLword)uVar7;
        pDVar2[10] = DVar5;
        *(uint *)(pDVar2 + 2) = uVar6 | 1;
      }
    }
    else if (uVar3 == 0) {
      do {
      } while( true );
    }
  }
  return;
}

Assistant:

void incusecount68k(FX *fx68k) {
  StackWord *scanptr68k;

  if (FX_INVALIDP(fx68k)) return;

  CHECK_FX(fx68k);

  if ((++(fx68k->usecount)) > MAXSAFEUSECOUNT)
    error("MP9324:Stack frame use count maximum exceeded");

  scanptr68k = (StackWord *)NativeAligned2FromStackOffset(fx68k->nextblock);
  switch (STKWORD(scanptr68k)->flags) {
    case STK_NOTFLG:
      while (STKWORD(scanptr68k)->flags != STK_BF)
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      break;

    case STK_BF: break;

    default:
      return;
      /* break; */
  } /* switch end */

  /* DEBUG */
  S_CHECK(
      (((Bframe *)scanptr68k)->residual == T) || (((Bframe *)scanptr68k)->ivar == fx68k->nextblock),
      "BF not residual, and IVER /= nextblock of prior frame");

  scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);

  if (STKWORD(scanptr68k)->flags == STK_FX) {
    CHECK_FX((FX *)scanptr68k);
    SET_FASTP_NIL(scanptr68k);
  }

}